

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
FlowGraph::WalkLoopBlocks(FlowGraph *this,BasicBlock *block,Loop *loop,JitArenaAllocator *tempAlloc)

{
  uint uVar1;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  ImplicitCallFlags newFlags;
  ushort uVar6;
  undefined4 *puVar7;
  Loop *this_00;
  BasicBlock *block_00;
  Type *ppFVar8;
  BasicBlock *pBVar9;
  Loop *pLVar10;
  BOOLEAN BVar11;
  Iterator local_40;
  
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x553,"(loop)","loop");
    if (!bVar4) {
LAB_003fb3a6:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this_00 = (Loop *)new<Memory::JitArenaAllocator>(0x20,tempAlloc,0x3d6ef4);
  this_00->implicitCallFlags = ImplicitCall_HasNoInfo;
  this_00->loopFlags = (LoopFlags)0x0;
  *(undefined6 *)&this_00->field_0x2 = 0;
  this_00->headBlock = (BasicBlock *)0x0;
  this_00->topFunc = (Func *)tempAlloc;
  *(Loop **)&this_00->loopNumber = this_00;
  pLVar10 = this_00;
  BVSparse<Memory::JitArenaAllocator>::Set
            ((BVSparse<Memory::JitArenaAllocator> *)this_00,block->number);
  AddBlockToLoop((FlowGraph *)pLVar10,block,loop);
  if (loop->headBlock != block) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    block_00 = block;
    do {
      BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((BVSparse<Memory::JitArenaAllocator> *)this_00,block_00->number);
      local_40.list =
           &(block_00->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      while( true ) {
        BVar11 = BVar5;
        if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
            (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) goto LAB_003fb3a6;
          *puVar7 = 0;
        }
        pSVar2 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (pSVar2 == local_40.list) break;
        local_40.current = (NodeBase *)pSVar2;
        ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            (&local_40);
        pBVar9 = (*ppFVar8)->succBlock;
        if (pBVar9 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x566,"(succ)","succ");
          if (!bVar4) goto LAB_003fb3a6;
          *puVar7 = 0;
        }
        BVar5 = BVar11;
        if ((((pBVar9->field_0x18 & 4) != 0) && (BVar5 = '\x01', loop->headBlock != pBVar9)) &&
           ((pBVar9->loop == (Loop *)0x0 || (BVar5 = BVar11, pBVar9->loop->headBlock != pBVar9)))) {
          pLVar10 = loop;
          if (BVar11 == '\0') {
            pLVar10 = (Loop *)0x0;
          }
          BuildLoop(this,pBVar9,block_00,pLVar10);
          BVar5 = BVar11;
        }
      }
      if (BVar11 != '\0') {
        local_40.list =
             &(block_00->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        while( true ) {
          if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
              (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) goto LAB_003fb3a6;
            *puVar7 = 0;
          }
          pSVar2 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                   (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if (pSVar2 == local_40.list) break;
          local_40.current = (NodeBase *)pSVar2;
          ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              (&local_40);
          pBVar9 = (*ppFVar8)->predBlock;
          if (pBVar9 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x57a,"(pred)","pred");
            if (!bVar4) goto LAB_003fb3a6;
            *puVar7 = 0;
          }
          pLVar10 = pBVar9->loop;
          if (((pLVar10 != loop && pLVar10 != (Loop *)0x0) &&
              (uVar1 = loop->headBlock->number, uVar1 < pLVar10->headBlock->number)) &&
             ((pLVar10->parent == (Loop *)0x0 || (pLVar10->parent->headBlock->number < uVar1)))) {
            pLVar10->parent = loop;
            loop->field_0x179 = loop->field_0x179 & 0xfe;
            pLVar10 = pBVar9->loop;
            uVar6 = *(ushort *)&pLVar10->field_0x178;
            if ((uVar6 & 8) != 0) {
              Loop::SetHasCall(loop);
              pLVar10 = pBVar9->loop;
              uVar6 = *(ushort *)&pLVar10->field_0x178;
            }
            if ((uVar6 & 0x10) != 0) {
              Loop::SetHasYield(loop);
              pLVar10 = pBVar9->loop;
            }
            newFlags = Loop::GetImplicitCallFlags(pLVar10);
            Loop::SetImplicitCallFlags(loop,newFlags);
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)this_00,pBVar9->number);
        }
        pLVar10 = block_00->loop;
        if ((pLVar10 == (Loop *)0x0) || (bVar4 = Loop::IsDescendentOrSelf(pLVar10,loop), bVar4)) {
          block_00->loop = loop;
        }
        if (block_00 != block) {
          AddBlockToLoop((FlowGraph *)pLVar10,block_00,loop);
        }
      }
      pBVar9 = BasicBlock::GetPrev(block_00);
      bVar4 = block_00 != loop->headBlock;
      block_00 = pBVar9;
    } while (bVar4);
  }
  return;
}

Assistant:

void
FlowGraph::WalkLoopBlocks(BasicBlock *block, Loop *loop, JitArenaAllocator *tempAlloc)
{
    AnalysisAssert(loop);

    BVSparse<JitArenaAllocator> *loopBlocksBv = JitAnew(tempAlloc, BVSparse<JitArenaAllocator>, tempAlloc);
    BasicBlock *tailBlock = block;
    BasicBlock *lastBlock;
    loopBlocksBv->Set(block->GetBlockNum());

    this->AddBlockToLoop(block, loop);

    if (block == loop->headBlock)
    {
        // Single block loop, we're done
        return;
    }

    do
    {
        BOOL isInLoop = loopBlocksBv->Test(block->GetBlockNum());

        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader)
            {
                // Found a loop back-edge
                if (loop->headBlock == succ)
                {
                    isInLoop = true;
                }
                else if (succ->loop == nullptr || succ->loop->headBlock != succ)
                {
                    // Recurse on inner loop
                    BuildLoop(succ, block, isInLoop ? loop : nullptr);
                }
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (isInLoop)
        {
            // This block is in the loop.  All of it's predecessors should be contained in the loop as well.
            FOREACH_PREDECESSOR_BLOCK(pred, block)
            {
                // Fix up loop parent if it isn't set already.
                // If pred->loop != loop, we're looking at an inner loop, which was already visited.
                // If pred->loop->parent == nullptr, this is the first time we see this loop from an outer
                // loop, so this must be an immediate child.
                if (pred->loop && pred->loop != loop && loop->headBlock->number < pred->loop->headBlock->number
                    && (pred->loop->parent == nullptr || pred->loop->parent->headBlock->number < loop->headBlock->number))
                {
                    pred->loop->parent = loop;
                    loop->isLeaf = false;
                    if (pred->loop->hasCall)
                    {
                        loop->SetHasCall();
                    }
                    if (pred->loop->hasYield)
                    {
                        loop->SetHasYield();
                    }
                    loop->SetImplicitCallFlags(pred->loop->GetImplicitCallFlags());
                }
                // Add pred to loop bit vector
                loopBlocksBv->Set(pred->GetBlockNum());
            } NEXT_PREDECESSOR_BLOCK;

            if (block->loop == nullptr || block->loop->IsDescendentOrSelf(loop))
            {
                block->loop = loop;
            }

            if (block != tailBlock)
            {
                this->AddBlockToLoop(block, loop);
            }
        }
        lastBlock = block;
        block = block->GetPrev();
    } while (lastBlock != loop->headBlock);
}